

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O3

void mbedtls_mpi_core_shift_l(mbedtls_mpi_uint *X,size_t limbs,size_t count)

{
  ulong uVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  
  sVar5 = count >> 6;
  bVar2 = (byte)count & 0x3f;
  if (0x3f < count) {
    sVar3 = limbs;
    if (sVar5 < limbs) {
      do {
        X[sVar3 - 1] = X[(sVar3 - 1) - sVar5];
        sVar3 = sVar3 - 1;
      } while (sVar5 < sVar3);
    }
    if (sVar3 != 0) {
      switchD_012e3010::default(X,0,sVar3 << 3);
    }
  }
  if (sVar5 < limbs && (count & 0x3f) != 0) {
    uVar4 = 0;
    do {
      uVar1 = X[sVar5];
      X[sVar5] = uVar1 << bVar2 | uVar4;
      sVar5 = sVar5 + 1;
      uVar4 = uVar1 >> (0x40 - bVar2 & 0x3f);
    } while (limbs != sVar5);
  }
  return;
}

Assistant:

void mbedtls_mpi_core_shift_l(mbedtls_mpi_uint *X, size_t limbs,
                              size_t count)
{
    size_t i, v0, v1;
    mbedtls_mpi_uint r0 = 0, r1;

    v0 = count / (biL);
    v1 = count & (biL - 1);

    /*
     * shift by count / limb_size
     */
    if (v0 > 0) {
        for (i = limbs; i > v0; i--) {
            X[i - 1] = X[i - v0 - 1];
        }

        for (; i > 0; i--) {
            X[i - 1] = 0;
        }
    }

    /*
     * shift by count % limb_size
     */
    if (v1 > 0) {
        for (i = v0; i < limbs; i++) {
            r1 = X[i] >> (biL - v1);
            X[i] <<= v1;
            X[i] |= r0;
            r0 = r1;
        }
    }
}